

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O3

void StopHTTPServer(void)

{
  long lVar1;
  string_view source_file;
  pointer ppeVar2;
  bool bVar3;
  Logger *pLVar4;
  pointer ptVar5;
  thread *thread;
  pointer ptVar6;
  pointer ppeVar7;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  size_t n_connections;
  string local_68;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar4 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,HTTP,Debug);
  if (bVar3) {
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp";
    source_file_00._M_len = 0x57;
    logging_function._M_str = "StopHTTPServer";
    logging_function._M_len = 0xe;
    LogPrintf_<>(logging_function,source_file_00,0x204,HTTP,Debug,"Stopping HTTP server\n");
  }
  if ((__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>)
      g_work_queue._M_t.
      super___uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>.
      _M_t.
      super__Tuple_impl<0UL,_WorkQueue<HTTPClosure>_*,_std::default_delete<WorkQueue<HTTPClosure>_>_>
      .super__Head_base<0UL,_WorkQueue<HTTPClosure>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>)0x0) {
    pLVar4 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,HTTP,Debug);
    if (bVar3) {
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
      ;
      source_file_01._M_len = 0x57;
      logging_function_00._M_str = "StopHTTPServer";
      logging_function_00._M_len = 0xe;
      LogPrintf_<>(logging_function_00,source_file_01,0x206,HTTP,Debug,
                   "Waiting for HTTP worker threads to exit\n");
    }
    ptVar5 = g_thread_http_workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    ptVar6 = g_thread_http_workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (g_thread_http_workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start !=
        g_thread_http_workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        std::thread::join();
        ptVar6 = ptVar6 + 1;
      } while (ptVar6 != ptVar5);
      ptVar5 = g_thread_http_workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (g_thread_http_workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          g_thread_http_workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        do {
          if ((ptVar5->_M_id)._M_thread != 0) {
            std::terminate();
          }
          ptVar5 = ptVar5 + 1;
        } while (ptVar5 != g_thread_http_workers.
                           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                           super__Vector_impl_data._M_finish);
        g_thread_http_workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish =
             g_thread_http_workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  ppeVar2 = boundSockets.
            super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppeVar7 = boundSockets.
            super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (boundSockets.super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      boundSockets.super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      evhttp_del_accept_socket(eventHTTP);
      ppeVar7 = ppeVar7 + 1;
    } while (ppeVar7 != ppeVar2);
    if (boundSockets.
        super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        boundSockets.
        super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      boundSockets.super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           boundSockets.
           super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>._M_impl
           .super__Vector_impl_data._M_start;
    }
  }
  n_connections = HTTPRequestTracker::CountActiveConnections(&g_requests);
  if (n_connections != 0) {
    pLVar4 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,HTTP,Debug);
    if (bVar3) {
      pLVar4 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar4);
      if (bVar3) {
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        tinyformat::format<unsigned_long>
                  (&local_68,"Waiting for %d connections to stop HTTP server\n",&n_connections);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pLVar4 = LogInstance();
        local_68._M_dataplus._M_p = (pointer)0x57;
        local_68._M_string_length = 0xf97859;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
        ;
        source_file._M_len = 0x57;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function_03._M_str = "StopHTTPServer";
        logging_function_03._M_len = 0xe;
        BCLog::Logger::LogPrintStr(pLVar4,str,logging_function_03,source_file,0x214,HTTP,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)log_msg._M_dataplus._M_p != &log_msg.field_2) {
          operator_delete(log_msg._M_dataplus._M_p,
                          CONCAT71(log_msg.field_2._M_allocated_capacity._1_7_,
                                   log_msg.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  HTTPRequestTracker::WaitUntilEmpty(&g_requests);
  if (eventHTTP != (evhttp *)0x0) {
    event_base_once(eventBase,0xffffffff,1,StopHTTPServer::anon_class_1_0_00000001::__invoke,0,0);
  }
  if (eventBase != (event_base *)0x0) {
    pLVar4 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,HTTP,Debug);
    if (bVar3) {
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
      ;
      source_file_02._M_len = 0x57;
      logging_function_01._M_str = "StopHTTPServer";
      logging_function_01._M_len = 0xe;
      LogPrintf_<>(logging_function_01,source_file_02,0x222,HTTP,Debug,
                   "Waiting for HTTP event thread to exit\n");
    }
    if (g_thread_http._M_id._M_thread != 0) {
      std::thread::join();
    }
    event_base_free(eventBase);
    eventBase = (event_base *)0x0;
  }
  std::__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>::reset
            ((__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
              *)&g_work_queue,(pointer)0x0);
  pLVar4 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,HTTP,Debug);
  if (bVar3) {
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp";
    source_file_03._M_len = 0x57;
    logging_function_02._M_str = "StopHTTPServer";
    logging_function_02._M_len = 0xe;
    LogPrintf_<>(logging_function_02,source_file_03,0x228,HTTP,Debug,"Stopped HTTP server\n");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void StopHTTPServer()
{
    LogDebug(BCLog::HTTP, "Stopping HTTP server\n");
    if (g_work_queue) {
        LogDebug(BCLog::HTTP, "Waiting for HTTP worker threads to exit\n");
        for (auto& thread : g_thread_http_workers) {
            thread.join();
        }
        g_thread_http_workers.clear();
    }
    // Unlisten sockets, these are what make the event loop running, which means
    // that after this and all connections are closed the event loop will quit.
    for (evhttp_bound_socket *socket : boundSockets) {
        evhttp_del_accept_socket(eventHTTP, socket);
    }
    boundSockets.clear();
    {
        if (const auto n_connections{g_requests.CountActiveConnections()}; n_connections != 0) {
            LogDebug(BCLog::HTTP, "Waiting for %d connections to stop HTTP server\n", n_connections);
        }
        g_requests.WaitUntilEmpty();
    }
    if (eventHTTP) {
        // Schedule a callback to call evhttp_free in the event base thread, so
        // that evhttp_free does not need to be called again after the handling
        // of unfinished request connections that follows.
        event_base_once(eventBase, -1, EV_TIMEOUT, [](evutil_socket_t, short, void*) {
            evhttp_free(eventHTTP);
            eventHTTP = nullptr;
        }, nullptr, nullptr);
    }
    if (eventBase) {
        LogDebug(BCLog::HTTP, "Waiting for HTTP event thread to exit\n");
        if (g_thread_http.joinable()) g_thread_http.join();
        event_base_free(eventBase);
        eventBase = nullptr;
    }
    g_work_queue.reset();
    LogDebug(BCLog::HTTP, "Stopped HTTP server\n");
}